

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

void opj_thread_pool_wait_completion(opj_thread_pool_t *tp,int max_remaining_jobs)

{
  int local_14;
  int max_remaining_jobs_local;
  opj_thread_pool_t *tp_local;
  
  if (tp->mutex != (opj_mutex_t *)0x0) {
    local_14 = max_remaining_jobs;
    if (max_remaining_jobs < 0) {
      local_14 = 0;
    }
    opj_mutex_lock(tp->mutex);
    tp->signaling_threshold = local_14;
    while (local_14 < tp->pending_jobs_count) {
      opj_cond_wait(tp->cond,tp->mutex);
    }
    opj_mutex_unlock(tp->mutex);
  }
  return;
}

Assistant:

void opj_thread_pool_wait_completion(opj_thread_pool_t* tp,
                                     int max_remaining_jobs)
{
    if (tp->mutex == NULL) {
        return;
    }

    if (max_remaining_jobs < 0) {
        max_remaining_jobs = 0;
    }
    opj_mutex_lock(tp->mutex);
    tp->signaling_threshold = max_remaining_jobs;
    while (tp->pending_jobs_count > max_remaining_jobs) {
        /*printf("tp=%p, jobs before wait = %d, max_remaining_jobs = %d\n", tp, tp->pending_jobs_count, max_remaining_jobs);*/
        opj_cond_wait(tp->cond, tp->mutex);
        /*printf("tp=%p, jobs after wait = %d\n", tp, tp->pending_jobs_count);*/
    }
    opj_mutex_unlock(tp->mutex);
}